

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.scanner.c
# Opt level: O1

void yyunput(int c,char *yy_bp)

{
  char *pcVar1;
  YY_BUFFER_STATE pyVar2;
  YY_BUFFER_STATE *ppyVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar5 = yy_c_buf_p;
  *yy_c_buf_p = yy_hold_char;
  sVar4 = yy_buffer_stack_top;
  ppyVar3 = yy_buffer_stack;
  pcVar8 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar5 < pcVar8 + 2) {
    pcVar7 = pcVar8 + (long)yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size + 2;
    pcVar8 = pcVar8 + (long)yy_n_chars + 2;
    while( true ) {
      pyVar2 = ppyVar3[sVar4];
      if (pcVar8 <= pyVar2->yy_ch_buf) break;
      pcVar1 = pcVar8 + -1;
      pcVar8 = pcVar8 + -1;
      pcVar7[-1] = *pcVar1;
      pcVar7 = pcVar7 + -1;
    }
    iVar6 = (int)pcVar7 - (int)pcVar8;
    pcVar5 = pcVar5 + iVar6;
    yy_n_chars = pyVar2->yy_buf_size;
    pyVar2->yy_n_chars = yy_n_chars;
    if (pcVar5 < pyVar2->yy_ch_buf + 2) {
      yy_fatal_error("flex scanner push-back overflow");
    }
    yy_bp = yy_bp + iVar6;
  }
  pcVar5[-1] = (char)c;
  yytext = yy_bp;
  yy_hold_char = pcVar5[-1];
  yy_c_buf_p = pcVar5 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp )
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}